

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::AsyncInputStream,_std::nullptr_t> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::getEntityBody
          (HttpInputStreamImpl *this,RequestOrResponse type,
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method,uint statusCode,HttpHeaders *headers)

{
  int iVar1;
  undefined4 uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  HttpNullEntityReader *this_00;
  long lVar6;
  ulonglong uVar7;
  Disposer *pDVar8;
  undefined4 in_register_0000000c;
  RequestOrResponse RVar9;
  HttpNullEntityReader *extraout_RDX;
  HttpNullEntityReader *extraout_RDX_00;
  HttpNullEntityReader *extraout_RDX_01;
  HttpNullEntityReader *extraout_RDX_02;
  HttpNullEntityReader *pHVar10;
  undefined4 in_register_00000034;
  HttpInputStreamImpl *params;
  char *in_R9;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Own<kj::(anonymous_namespace)::HttpNullEntityReader,_std::nullptr_t> OVar14;
  Own<kj::AsyncInputStream,_std::nullptr_t> OVar15;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f_2;
  RequestOrResponse type_local;
  Fault f;
  StringPtr local_40;
  
  params = (HttpInputStreamImpl *)CONCAT44(in_register_00000034,type);
  RVar9 = (RequestOrResponse)method;
  _kjCondition.left = (params->headerBuffer).size_;
  uVar3 = (ulong)_kjCondition._8_8_ >> 0x20;
  _kjCondition._8_8_ = uVar3 << 0x20;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = _kjCondition.left != 0;
  type_local = RVar9;
  if (_kjCondition.left == 0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[52]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x854,FAILED,"headerBuffer.size() > 0",
               "_kjCondition,\"Cannot get entity body after header buffer release.\"",&_kjCondition,
               (char (*) [52])"Cannot get entity body after header buffer release.");
    kj::_::Debug::Fault::fatal(&f);
  }
  iVar1 = *(int *)CONCAT44(in_register_0000000c,statusCode);
  if (iVar1 == 1) {
    if (RVar9 != RESPONSE) goto LAB_003f18ab;
    if (((int *)CONCAT44(in_register_0000000c,statusCode))[2] != 1) {
      bVar11 = false;
      goto LAB_003f187d;
    }
    lVar6 = *(long *)(in_R9 + 8);
    if (*(ulong *)(lVar6 + 0x58) < 2) {
      uVar3 = *(ulong *)(lVar6 + 0x68);
      this_00 = (HttpNullEntityReader *)operator_new(0x28);
      bVar11 = uVar3 < 2;
      _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,bVar11);
      if (bVar11) {
        _kjCondition.right = 0;
        _kjCondition._12_4_ = 0;
      }
    }
    else {
      uVar7 = strtoull(*(char **)(lVar6 + 0x50),(char **)0x0,10);
      this_00 = (HttpNullEntityReader *)operator_new(0x28);
      _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,1);
      _kjCondition._8_8_ = uVar7;
    }
    HttpNullEntityReader::HttpNullEntityReader(this_00,params,(Maybe<unsigned_long> *)&_kjCondition)
    ;
    pDVar8 = (Disposer *)
             &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpNullEntityReader>::instance;
    pHVar10 = extraout_RDX_02;
LAB_003f1b57:
    OVar14.ptr = pHVar10;
    OVar14.disposer = pDVar8;
    (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)pDVar8;
    (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
    currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)this_00;
  }
  else {
    bVar11 = iVar1 == 2;
    if (RVar9 == RESPONSE) {
LAB_003f187d:
      iVar1 = (int)headers;
      if (bVar11 && iVar1 - 200U < 100) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x86c,FAILED,(char *)0x0,
                   "\"a CONNECT response with a 2xx status does not have an entity body to get\"",
                   (char (*) [73])
                   "a CONNECT response with a 2xx status does not have an entity body to get");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      if ((iVar1 != 0x130) && (iVar1 != 0xcc)) goto LAB_003f18ab;
LAB_003f1b00:
      OVar14 = heap<kj::(anonymous_namespace)::HttpNullEntityReader,kj::(anonymous_namespace)::HttpInputStreamImpl&,unsigned_long>
                         ((kj *)&_kjCondition,params,(unsigned_long *)0x0);
    }
    else {
LAB_003f18ab:
      lVar6 = *(long *)(in_R9 + 8);
      uVar4 = *(ulong *)(lVar6 + 0x68);
      if (uVar4 < 2) {
LAB_003f1a1d:
        if ((char *)0x1 < *(char **)(lVar6 + 0x58)) {
          pcVar5 = *(char **)(lVar6 + 0x50);
          _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,1);
          _kjCondition._8_8_ = pcVar5;
          _kjCondition.op.content.ptr = *(char **)(lVar6 + 0x58);
          uVar7 = strtoull(pcVar5,(char **)&f,10);
          if (((char *)CONCAT71(f.exception._1_7_,f.exception._0_1_) <= pcVar5) ||
             (*(char *)CONCAT71(f.exception._1_7_,f.exception._0_1_) != '\0')) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36],kj::StringPtr&>
                      (&f_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0x89a,FAILED,(char *)0x0,"\"invalid Content-Length header value\", cl",
                       (char (*) [36])"invalid Content-Length header value",
                       (StringPtr *)&_kjCondition.right);
            kj::_::Debug::Fault::fatal(&f_2);
          }
          this_00 = (HttpNullEntityReader *)operator_new(0x28);
          HttpEntityBodyReader::HttpEntityBodyReader((HttpEntityBodyReader *)this_00,params);
          (this_00->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
               (_func_int **)&PTR_read_006d6d78;
          *(ulonglong *)&(this_00->length).ptr.isSet = uVar7;
          *(undefined1 *)&(this_00->length).ptr.field_1 = 1;
          pHVar10 = extraout_RDX_00;
          if (uVar7 == 0) {
            HttpEntityBodyReader::doneReading((HttpEntityBodyReader *)this_00);
            pHVar10 = extraout_RDX_01;
          }
          pDVar8 = (Disposer *)
                   &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpFixedLengthEntityReader>::
                    instance;
          goto LAB_003f1b57;
        }
        if (RVar9 == REQUEST) goto LAB_003f1b00;
        if (0x14 < *(ulong *)(lVar6 + 0xe8)) {
          pcVar5 = *(char **)(lVar6 + 0xe0);
          uVar2 = *(undefined4 *)(pcVar5 + 0x10);
          auVar13[0] = -((char)uVar2 == 'n');
          auVar13[1] = -((char)((uint)uVar2 >> 8) == 'g');
          auVar13[2] = -((char)((uint)uVar2 >> 0x10) == 'e');
          auVar13[3] = -((char)((uint)uVar2 >> 0x18) == 's');
          auVar13[4] = 0xff;
          auVar13[5] = 0xff;
          auVar13[6] = 0xff;
          auVar13[7] = 0xff;
          auVar13[8] = 0xff;
          auVar13[9] = 0xff;
          auVar13[10] = 0xff;
          auVar13[0xb] = 0xff;
          auVar13[0xc] = 0xff;
          auVar13[0xd] = 0xff;
          auVar13[0xe] = 0xff;
          auVar13[0xf] = 0xff;
          auVar12[0] = -(*pcVar5 == 'm');
          auVar12[1] = -(pcVar5[1] == 'u');
          auVar12[2] = -(pcVar5[2] == 'l');
          auVar12[3] = -(pcVar5[3] == 't');
          auVar12[4] = -(pcVar5[4] == 'i');
          auVar12[5] = -(pcVar5[5] == 'p');
          auVar12[6] = -(pcVar5[6] == 'a');
          auVar12[7] = -(pcVar5[7] == 'r');
          auVar12[8] = -(pcVar5[8] == 't');
          auVar12[9] = -(pcVar5[9] == '/');
          auVar12[10] = -(pcVar5[10] == 'b');
          auVar12[0xb] = -(pcVar5[0xb] == 'y');
          auVar12[0xc] = -(pcVar5[0xc] == 't');
          auVar12[0xd] = -(pcVar5[0xd] == 'e');
          auVar12[0xe] = -(pcVar5[0xe] == 'r');
          auVar12[0xf] = -(pcVar5[0xf] == 'a');
          auVar12 = auVar12 & auVar13;
          if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[141]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0x8ae,FAILED,(char *)0x0,
                       "\"refusing to handle multipart/byteranges response without transfer-encoding nor \" \"content-length due to ambiguity between RFC 2616 vs RFC 7230.\""
                       ,(char (*) [141])
                        "refusing to handle multipart/byteranges response without transfer-encoding nor content-length due to ambiguity between RFC 2616 vs RFC 7230."
                      );
            kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
          }
        }
        OVar14 = (Own<kj::(anonymous_namespace)::HttpNullEntityReader,_std::nullptr_t>)
                 heap<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader,kj::(anonymous_namespace)::HttpInputStreamImpl&>
                           ((kj *)&_kjCondition,params);
      }
      else {
        local_40.content.ptr = *(char **)(lVar6 + 0x60);
        f.exception._0_1_ = 1;
        local_40.content.size_ = uVar4;
        if ((*local_40.content.ptr & 0xdfU) != 0x49) {
          if ((((((*local_40.content.ptr & 0xdfU) == 0x43) &&
                ((((byte *)local_40.content.ptr)[1] & 0xdf) == 0x48)) &&
               ((((byte *)local_40.content.ptr)[2] & 0xdf) == 0x55)) &&
              (((((byte *)local_40.content.ptr)[3] & 0xdf) == 0x4e &&
               ((((byte *)local_40.content.ptr)[4] & 0xdf) == 0x4b)))) &&
             (((((byte *)local_40.content.ptr)[5] & 0xdf) == 0x45 &&
              (((((byte *)local_40.content.ptr)[6] & 0xdf) == 0x44 &&
               (((byte *)local_40.content.ptr)[7] == 0)))))) {
            this_00 = (HttpNullEntityReader *)operator_new(0x28);
            HttpEntityBodyReader::HttpEntityBodyReader((HttpEntityBodyReader *)this_00,params);
            (this_00->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
                 (_func_int **)&PTR_read_006d6c58;
            *(undefined8 *)&(this_00->length).ptr.isSet = 0;
            *(undefined1 *)&(this_00->length).ptr.field_1 = 1;
            pDVar8 = (Disposer *)
                     &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityReader>::
                      instance;
            pHVar10 = extraout_RDX;
            goto LAB_003f1b57;
          }
LAB_003f19de:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x88c,FAILED,(char *)0x0,"\"unknown transfer encoding\", te",
                     (char (*) [26])"unknown transfer encoding",&local_40);
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          lVar6 = *(long *)(in_R9 + 8);
          goto LAB_003f1a1d;
        }
        if (((((((byte *)local_40.content.ptr)[1] & 0xdf) != 0x44) ||
             ((((byte *)local_40.content.ptr)[2] & 0xdf) != 0x45)) ||
            ((((byte *)local_40.content.ptr)[3] & 0xdf) != 0x4e)) ||
           ((((((byte *)local_40.content.ptr)[4] & 0xdf) != 0x54 ||
             ((((byte *)local_40.content.ptr)[5] & 0xdf) != 0x49)) ||
            (((((byte *)local_40.content.ptr)[6] & 0xdf) != 0x54 ||
             (((char)(((byte *)local_40.content.ptr)[7] & 0xffffffdf) != 'Y' ||
              (((byte *)local_40.content.ptr)[8] != 0)))))))) goto LAB_003f19de;
        _kjCondition.left = (unsigned_long)&type_local;
        _kjCondition._8_8_ = uVar3 << 0x20;
        _kjCondition.op.content.ptr = " != ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = RVar9 != REQUEST;
        if (RVar9 == REQUEST) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<kj::(anonymous_namespace)::HttpInputStreamImpl::RequestOrResponse&,kj::(anonymous_namespace)::HttpInputStreamImpl::RequestOrResponse>&,char_const(&)[62]>
                    (&f_2,(char *)&_kjCondition,0x5019fe,
                     ((byte *)local_40.content.ptr)[7] & 0xffffffdf,(char *)headers,in_R9,
                     (DebugComparison<kj::(anonymous_namespace)::HttpInputStreamImpl::RequestOrResponse_&,_kj::(anonymous_namespace)::HttpInputStreamImpl::RequestOrResponse>
                      *)_kjCondition.left,(char (*) [62])_kjCondition._8_8_);
          kj::_::Debug::Fault::fatal(&f_2);
        }
        OVar14 = (Own<kj::(anonymous_namespace)::HttpNullEntityReader,_std::nullptr_t>)
                 heap<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader,kj::(anonymous_namespace)::HttpInputStreamImpl&>
                           ((kj *)&_kjCondition,params);
      }
    }
    (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)_kjCondition.left;
    (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
    currentWrapper.ptr =
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)_kjCondition._8_8_;
  }
  OVar15.disposer = OVar14.disposer;
  OVar15.ptr = (AsyncInputStream *)OVar14.ptr;
  return OVar15;
}

Assistant:

kj::Own<kj::AsyncInputStream> HttpInputStreamImpl::getEntityBody(
    RequestOrResponse type,
    kj::OneOf<HttpMethod, HttpConnectMethod> method,
    uint statusCode,
    const kj::HttpHeaders& headers) {
  KJ_REQUIRE(headerBuffer.size() > 0, "Cannot get entity body after header buffer release.");

  auto isHeadRequest = method.tryGet<HttpMethod>().map([](auto& m) {
    return m == HttpMethod::HEAD;
  }).orDefault(false);

  auto isConnectRequest = method.is<HttpConnectMethod>();

  // Rules to determine how HTTP entity-body is delimited:
  //   https://tools.ietf.org/html/rfc7230#section-3.3.3
  // #1
  if (type == RESPONSE) {
    if (isHeadRequest) {
      // Body elided.
      kj::Maybe<uint64_t> length;
      KJ_IF_SOME(cl, headers.get(HttpHeaderId::CONTENT_LENGTH)) {
        length = strtoull(cl.cStr(), nullptr, 10);
      } else if (headers.get(HttpHeaderId::TRANSFER_ENCODING) == kj::none) {
        // HACK: Neither Content-Length nor Transfer-Encoding header in response to HEAD
        //   request. Propagate this fact with a 0 expected body length.
        length = uint64_t(0);
      }
      return kj::heap<HttpNullEntityReader>(*this, length);
    } else if (isConnectRequest && statusCode >= 200 && statusCode < 300) {
      KJ_FAIL_ASSERT("a CONNECT response with a 2xx status does not have an entity body to get");
    } else if (statusCode == 204 || statusCode == 304) {
      // No body.
      return kj::heap<HttpNullEntityReader>(*this, uint64_t(0));
    }
  }

  // For CONNECT requests messages, we let the rest of the logic play out.
  // We already check before here to ensure that Transfer-Encoding and
  // Content-Length headers are not present in which case the code below
  // does the right thing.

  // #3
  KJ_IF_SOME(te, headers.get(HttpHeaderId::TRANSFER_ENCODING)) {
    // TODO(someday): Support pluggable transfer encodings? Or at least gzip?
    // TODO(someday): Support stacked transfer encodings, e.g. "gzip, chunked".

    // NOTE: #3¶3 is ambiguous about what should happen if Transfer-Encoding and Content-Length are
    //   both present. It says that Transfer-Encoding takes precedence, but also that the request
    //   "ought to be handled as an error", and that proxies "MUST" drop the Content-Length before
    //   forwarding. We ignore the vague "ought to" part and implement the other two. (The
    //   dropping of Content-Length will happen naturally if/when the message is sent back out to
    //   the network.)
    if (fastCaseCmp<'c','h','u','n','k','e','d'>(te.cStr())) {
      // #3¶1
      return kj::heap<HttpChunkedEntityReader>(*this);
    } else if (fastCaseCmp<'i','d','e','n','t','i','t','y'>(te.cStr())) {
      // #3¶2
      KJ_REQUIRE(type != REQUEST, "request body cannot have Transfer-Encoding other than chunked");
      return kj::heap<HttpConnectionCloseEntityReader>(*this);
    }

    KJ_FAIL_REQUIRE("unknown transfer encoding", te) { break; };
  }

  // #4 and #5
  KJ_IF_SOME(cl, headers.get(HttpHeaderId::CONTENT_LENGTH)) {
    // NOTE: By spec, multiple Content-Length values are allowed as long as they are the same, e.g.
    //   "Content-Length: 5, 5, 5". Hopefully no one actually does that...
    char* end;
    uint64_t length = strtoull(cl.cStr(), &end, 10);
    if (end > cl.begin() && *end == '\0') {
      // #5
      return kj::heap<HttpFixedLengthEntityReader>(*this, length);
    } else {
      // #4 (bad content-length)
      KJ_FAIL_REQUIRE("invalid Content-Length header value", cl);
    }
  }

  // #6
  if (type == REQUEST) {
    // Lack of a Content-Length or Transfer-Encoding means no body for requests.
    return kj::heap<HttpNullEntityReader>(*this, uint64_t(0));
  }

  // RFC 2616 permitted "multipart/byteranges" responses to be self-delimiting, but this was
  // mercifully removed in RFC 7230, and new exceptions of this type are disallowed:
  //   https://www.w3.org/Protocols/rfc2616/rfc2616-sec4.html#sec4.4
  //   https://tools.ietf.org/html/rfc7230#page-81
  // To be extra-safe, we'll reject a multipart/byteranges response that lacks transfer-encoding
  // and content-length.
  KJ_IF_SOME(type, headers.get(HttpHeaderId::CONTENT_TYPE)) {
    if (type.startsWith("multipart/byteranges")) {
      KJ_FAIL_REQUIRE(
          "refusing to handle multipart/byteranges response without transfer-encoding nor "
          "content-length due to ambiguity between RFC 2616 vs RFC 7230.");
    }
  }

  // #7
  return kj::heap<HttpConnectionCloseEntityReader>(*this);
}